

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setVertexData(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
             int index)

{
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  int index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((-1 < index) && (index < this->vertexCount)) {
    pGVar1 = this->vertexList;
    local_1c = index;
    pbStack_18 = data;
    data_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    std::__cxx11::string::string((string *)&local_40,(string *)data);
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    setData(pGVar1 + index,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Graph<T>::setVertexData(T data, int index)
{
  //sets the data for the vertex at the passed index
  //we only set the data if the index passed is valid
  if(index >= 0 && index < vertexCount)
  {
    vertexList[index].setData(data);
  }

}